

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

string * __thiscall
spvtools::val::(anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Decoration *decoration,
          Instruction *built_in_inst,Instruction *referenced_inst,Instruction *referenced_from_inst,
          ExecutionModel execution_model)

{
  long lVar1;
  BuiltIn operand;
  ostream *poVar2;
  char *pcVar3;
  Instruction *inst;
  Instruction *inst_00;
  Instruction *inst_01;
  string local_1e8;
  string local_1c8;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  GetIdDesc_abi_cxx11_(&local_1e8,(_anonymous_namespace_ *)referenced_from_inst,inst);
  poVar2 = std::operator<<((ostream *)&ss,(string *)&local_1e8);
  poVar2 = std::operator<<(poVar2," is referencing ");
  GetIdDesc_abi_cxx11_(&local_1c8,(_anonymous_namespace_ *)referenced_inst,inst_00);
  std::operator<<(poVar2,(string *)&local_1c8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  if ((built_in_inst->inst_).result_id != (referenced_inst->inst_).result_id) {
    poVar2 = std::operator<<((ostream *)&ss," which is dependent on ");
    GetIdDesc_abi_cxx11_(&local_1e8,(_anonymous_namespace_ *)built_in_inst,inst_01);
    std::operator<<(poVar2,(string *)&local_1e8);
    std::__cxx11::string::_M_dispose();
  }
  std::operator<<((ostream *)&ss," which is decorated with BuiltIn ");
  lVar1 = *this;
  operand = Decoration::builtin(decoration);
  pcVar3 = AssemblyGrammar::lookupOperandName
                     ((AssemblyGrammar *)(lVar1 + 0x438),SPV_OPERAND_TYPE_BUILT_IN,operand);
  std::operator<<((ostream *)&ss,pcVar3);
  if (*(int *)((long)this + 0x38) != 0) {
    poVar2 = std::operator<<((ostream *)&ss," in function <");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,">");
    if (execution_model != ExecutionModelMax) {
      std::operator<<((ostream *)&ss," called with execution model ");
      pcVar3 = AssemblyGrammar::lookupOperandName
                         ((AssemblyGrammar *)(*this + 0x438),SPV_OPERAND_TYPE_EXECUTION_MODEL,
                          execution_model);
      std::operator<<((ostream *)&ss,pcVar3);
    }
  }
  std::operator<<((ostream *)&ss,".");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string BuiltInsValidator::GetReferenceDesc(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst, const Instruction& referenced_from_inst,
    spv::ExecutionModel execution_model) const {
  std::ostringstream ss;
  ss << GetIdDesc(referenced_from_inst) << " is referencing "
     << GetIdDesc(referenced_inst);
  if (built_in_inst.id() != referenced_inst.id()) {
    ss << " which is dependent on " << GetIdDesc(built_in_inst);
  }

  ss << " which is decorated with BuiltIn ";
  ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                      (uint32_t)decoration.builtin());
  if (function_id_) {
    ss << " in function <" << function_id_ << ">";
    if (execution_model != spv::ExecutionModel::Max) {
      ss << " called with execution model ";
      ss << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_EXECUTION_MODEL,
                                          uint32_t(execution_model));
    }
  }
  ss << ".";
  return ss.str();
}